

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lev_main.c
# Opt level: O1

int get_object_id(char *s,char c)

{
  char *__s2;
  int iVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  objdescr *poVar5;
  char *pcVar6;
  
  if (c < '\x01') {
    iVar1 = 0;
  }
  else {
    iVar1 = def_char_to_objclass(c);
  }
  if (iVar1 != 0x12) {
    if (iVar1 == 0) {
      iVar3 = 0;
    }
    else {
      iVar3 = bases[iVar1];
    }
    if (iVar3 < 0x21a) {
      lVar4 = (long)iVar3;
      poVar5 = obj_descr + lVar4;
      pcVar6 = &objects[lVar4].oc_class;
      do {
        lVar4 = lVar4 + 1;
        if ((iVar1 != 0) && (iVar1 != *pcVar6)) break;
        if ((poVar5->oc_name != (char *)0x0) && (iVar2 = strcmp(s,poVar5->oc_name), iVar2 == 0)) {
          return iVar3;
        }
        iVar3 = iVar3 + 1;
        poVar5 = poVar5 + 1;
        pcVar6 = pcVar6 + 0x28;
      } while ((int)lVar4 != 0x21a);
    }
    if (iVar1 == 0) {
      iVar3 = 0;
    }
    else {
      iVar3 = bases[iVar1];
    }
    if (iVar3 < 0x21a) {
      lVar4 = (long)iVar3;
      poVar5 = obj_descr + lVar4;
      pcVar6 = &objects[lVar4].oc_class;
      do {
        lVar4 = lVar4 + 1;
        if ((iVar1 != 0) && (iVar1 != *pcVar6)) {
          return -1;
        }
        __s2 = poVar5->oc_name;
        if ((__s2 != (char *)0x0) && (iVar2 = strcasecmp(s,__s2), iVar2 == 0)) {
          if (be_verbose != 0) {
            lc_warning("Object type \"%s\" matches \"%s\".",s,__s2);
            return iVar3;
          }
          return iVar3;
        }
        iVar3 = iVar3 + 1;
        poVar5 = poVar5 + 1;
        pcVar6 = pcVar6 + 0x28;
      } while ((int)lVar4 != 0x21a);
    }
  }
  return -1;
}

Assistant:

int get_object_id(char *s, char c)
{
	int i, class;
	const char *objname;

	class = (c > 0) ? def_char_to_objclass(c) : 0;
	if (class == MAXOCLASSES) return ERR;

	for (i = class ? bases[class] : 0; i < NUM_OBJECTS; i++) {
	    if (class && objects[i].oc_class != class) break;
	    objname = obj_descr[i].oc_name;
	    if (objname && !strcmp(s, objname))
		return i;
	}

	for (i = class ? bases[class] : 0; i < NUM_OBJECTS; i++) {
	    if (class && objects[i].oc_class != class) break;
	    objname = obj_descr[i].oc_name;
	    if (objname && !strcasecmp(s, objname)) {
		if (be_verbose)
		    lc_warning("Object type \"%s\" matches \"%s\".", s, objname);
		return i;
	    }
	}

	return ERR;
}